

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_filter.cpp
# Opt level: O1

void anon_unknown.dwarf_5a022::SequenceTester<QList<int>_>::exec(void)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  PromiseResolver<QList<int>_> PVar3;
  Data *pDVar4;
  bool bVar5;
  PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *this;
  PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *this_00;
  PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *this_01;
  PromiseData<QList<int>_> *pPVar6;
  const_iterator expectedBegin;
  QPromiseReject<QList<int>_> *reject;
  PromiseResolver<QList<int>_> resolver_3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_180;
  Data *local_178;
  _func_int **local_170;
  _Any_data local_168;
  code *local_158;
  code *pcStack_150;
  QList<int> local_148;
  function<void_(const_QList<int>_&)> local_128;
  QPromise<QList<int>_> p;
  PromiseResolver<QList<int>_> resolver;
  _Manager_type local_e8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> local_d0 [2];
  QSharedData *local_c0;
  QList<int> local_b8;
  QSharedData *local_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  _func_int **local_58;
  _Any_data local_50;
  code *local_40;
  
  reject = (QPromiseReject<QList<int>_> *)0x1;
  local_b8.d.ptr = (int *)QArrayData::allocate((QArrayData **)&local_b8,4,8,10,KeepSize);
  local_b8.d.ptr[0] = 0x2a;
  local_b8.d.ptr[1] = 0x2b;
  local_b8.d.ptr[2] = 0x2c;
  local_b8.d.ptr[3] = 0x2d;
  local_b8.d.ptr[4] = 0x2e;
  local_b8.d.ptr[5] = 0x2f;
  local_b8.d.ptr[6] = 0x30;
  local_b8.d.ptr[7] = 0x31;
  local_b8.d.ptr[8] = 0x32;
  local_b8.d.ptr[9] = 0x33;
  local_b8.d.size = 10;
  this = (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)operator_new(0x68);
  this->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this->super_QSharedData = 0;
  (this->m_error).m_data._M_exception_object = (void *)0x0;
  this[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->m_catchers).d.size = 0;
  (this->m_handlers).d.size = 0;
  (this->m_catchers).d.d = (Data *)0x0;
  (this->m_handlers).d.d = (Data *)0x0;
  (this->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  *(undefined8 *)&this->m_lock = 0;
  *(undefined8 *)&this->m_settled = 0;
  *(undefined8 *)&this[1].super_QSharedData = 0;
  this->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014b508;
  QReadWriteLock::QReadWriteLock(&this->m_lock,0);
  this->m_settled = false;
  (this->m_handlers).d.d = (Data *)0x0;
  (this->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  (this->m_handlers).d.size = 0;
  (this->m_catchers).d.d = (Data *)0x0;
  (this->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->m_catchers).d.size = 0;
  (this->m_error).m_data._M_exception_object = (void *)0x0;
  local_170 = (_func_int **)&PTR__PromiseData_0014b490;
  this->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_0014b490;
  this[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this[1].super_QSharedData = 0;
  LOCK();
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_a0 = &this->super_QSharedData;
  local_128.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0014b458;
  local_128.super__Function_base._M_functor._8_8_ = this;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver,(QPromise<QList<int>_> *)&local_128);
  local_128.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0014b428;
  if ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)
      local_128.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_128.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)
        local_128.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)0x0)) {
      (**(code **)(*(long *)local_128.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar3.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_168._M_unused._M_object = (void *)resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_178 = (Data *)&PTR__QPromiseBase_0014b428;
  QtPromisePrivate::PromiseResolver<QList<int>>::resolve<QList<int>>
            ((PromiseResolver<QList<int>> *)local_168._M_pod_data,&local_b8);
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  if ((Data *)local_168._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_168._M_unused._0_8_ = *local_168._M_unused._M_object + -1;
    UNLOCK();
    if ((*local_168._M_unused._M_object == 0) && ((Data *)local_168._M_unused._0_8_ != (Data *)0x0))
    {
      operator_delete(local_168._M_unused._M_object,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  this_00 = (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)operator_new(0x68);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  *(undefined8 *)&this_00[1].super_QSharedData = 0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0014b508;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = local_170;
  this_00[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00[1].super_QSharedData = 0;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_c0 = &this_00->super_QSharedData;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_128.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0014b458;
  local_128.super__Function_base._M_functor._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver,(QPromise<QList<int>_> *)&local_128);
  local_128.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0014b428;
  if ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)
      local_128.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_128.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)
        local_128.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)0x0)) {
      (**(code **)(*(long *)local_128.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar3.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_168._M_unused._M_object = (void *)resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_58 = (_func_int **)&PTR__PromiseDataBase_0014b508;
  local_78._M_unused._M_object = (void *)resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> *)
  local_98._M_unused._0_8_)->d = (Data *)PVar3.m_d.d;
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> *)
  ((long)local_98._M_unused._0_8_ + 8))->d = (Data *)PVar3.m_d.d;
  if (PVar3.m_d.d == (Data *)0x0) {
    pcStack_80 = std::
                 _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
    pcStack_80 = std::
                 _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  pDVar4 = local_178;
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            (this,(function<void_(const_QList<int>_&)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&local_168,
             (QPromiseResolve<QList<int>_> *)&local_78,reject);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            (this,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if ((Data *)local_78._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_78._M_unused._0_8_ = *local_78._M_unused._M_object + -1;
    UNLOCK();
    if ((*local_78._M_unused._M_object == 0) && ((Data *)local_78._M_unused._0_8_ != (Data *)0x0)) {
      operator_delete(local_78._M_unused._M_object,0x10);
    }
  }
  if ((Data *)local_168._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_168._M_unused._0_8_ = *local_168._M_unused._M_object + -1;
    UNLOCK();
    if ((*local_168._M_unused._M_object == 0) && ((Data *)local_168._M_unused._0_8_ != (Data *)0x0))
    {
      operator_delete(local_168._M_unused._M_object,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending(this);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch(this);
  }
  this_01 = (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)operator_new(0x68);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  this_01->_vptr_PromiseDataBase = local_58;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = local_170;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = &this_01->super_QSharedData;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_128.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0014b458;
  local_128.super__Function_base._M_functor._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver,(QPromise<QList<int>_> *)&local_128);
  local_128.super__Function_base._M_functor._M_unused._M_object = pDVar4;
  if ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)
      local_128.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)0x0) {
    LOCK();
    pQVar2 = (QSharedData *)(local_128.super__Function_base._M_functor._8_8_ + 8);
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)
        local_128.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)0x0)) {
      (**(code **)(*(long *)local_128.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  PVar3.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_148.d.d = (Data *)resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_3 = resolver;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_158 = (code *)0x0;
  pcStack_150 = (code *)0x0;
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_168._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> *)
  local_168._M_unused._0_8_)->d = (Data *)PVar3.m_d.d;
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> *)
  ((long)local_168._M_unused._0_8_ + 8))->d = (Data *)PVar3.m_d.d;
  if (PVar3.m_d.d == (Data *)0x0) {
    pcStack_150 = std::
                  _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                  ::_M_invoke;
    local_158 = std::
                _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
    pcStack_150 = std::
                  _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                  ::_M_invoke;
    local_158 = std::
                _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                ::_M_manager;
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            (this_00,(function<void_(const_QList<int>_&)> *)&local_168);
  pDVar4 = local_178;
  if (local_158 != (code *)0x0) {
    (*local_158)(&local_168,&local_168,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78,
             (PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&local_148,
             (QPromiseResolve<QList<int>_> *)&resolver_3,reject);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            (this_00,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (resolver_3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_3.m_d.d == 0) && (resolver_3.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_3.m_d.d,0x10);
    }
  }
  if ((Data *)local_148.d.d != (Data *)0x0) {
    LOCK();
    (((QSharedData *)&(local_148.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)&(local_148.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((((QSharedData *)&(local_148.d.d)->super_QArrayData)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       ((Data *)local_148.d.d != (Data *)0x0)) {
      operator_delete(local_148.d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    (this_00);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch(this_00);
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)pDVar4;
  pPVar6 = (PromiseData<QList<int>_> *)operator_new(0x68);
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData = 0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled =
       0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       local_58;
  QReadWriteLock::QReadWriteLock
            (&(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_lock,0);
  pDVar4 = local_178;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_settled = false;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_bool_&)>_> *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_handlers.d.size = 0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_catchers.d.size = 0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase =
       local_170;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar2 = &(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData
  ;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar2 = &(pPVar6->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_148.d.d = (Data *)&PTR__QPromiseBase_0014b458;
  local_148.d.ptr = (int *)pPVar6;
  p.super_QPromiseBase<QList<int>_>.m_d.d = pPVar6;
  QtPromisePrivate::PromiseResolver<QList<int>_>::PromiseResolver
            (&resolver_3,(QPromise<QList<int>_> *)&local_148);
  local_148.d.d = pDVar4;
  if ((PromiseData<QList<int>_> *)local_148.d.ptr != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar2 = &((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_148.d.ptr)->
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<QList<int>_> *)local_148.d.ptr != (PromiseData<QList<int>_> *)0x0)) {
      (*((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_148.d.ptr)->
        _vptr_PromiseDataBase[1])();
    }
  }
  PVar3.m_d.d = resolver_3.m_d.d;
  if (resolver_3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
  }
  local_180 = resolver_3.m_d.d;
  if (resolver_3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
  }
  local_d0[0] = resolver_3.m_d.d;
  if (resolver_3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
  }
  local_128.super__Function_base._M_manager = (_Manager_type)0x0;
  local_128._M_invoker = (_Invoker_type)0x0;
  local_128.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_128.super__Function_base._M_functor._8_8_ = 0;
  local_128.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> *)
  local_128.super__Function_base._M_functor._M_unused._0_8_)->d = (Data *)PVar3.m_d.d;
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<int>_>::Data> *)
  ((long)local_128.super__Function_base._M_functor._M_unused._0_8_ + 8))->d = (Data *)PVar3.m_d.d;
  if (PVar3.m_d.d == (Data *)0x0) {
    local_128._M_invoker =
         std::
         _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_invoke;
    local_128.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
    local_128._M_invoker =
         std::
         _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_invoke;
    local_128.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
         ::_M_manager;
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            (this_01,&local_128);
  pDVar4 = local_178;
  if (local_128.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_128.super__Function_base._M_manager)
              ((_Any_data *)&local_128,(_Any_data *)&local_128,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<int>>,QtPromise::QPromiseReject<QList<int>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver,
             (PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&local_180,
             (QPromiseResolve<QList<int>_> *)local_d0,reject);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            (this_01,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  if (local_e8 != (_Manager_type)0x0) {
    (*local_e8)((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  }
  if (local_d0[0].d != (Data *)0x0) {
    LOCK();
    ((local_d0[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_d0[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         ((local_d0[0].d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
       (local_d0[0].d != (Data *)0x0)) {
      operator_delete(local_d0[0].d,0x10);
    }
  }
  if (local_180.d != (Data *)0x0) {
    LOCK();
    ((local_180.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_180.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_180.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_180.d != (Data *)0x0)) {
      operator_delete(local_180.d,0x10);
    }
  }
  if (resolver_3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_3.m_d.d == 0) && (resolver_3.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_3.m_d.d,0x10);
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014b458;
  bVar5 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    (this_01);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch(this_01);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int> == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (local_c0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_c0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_c0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (local_a0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_a0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_a0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this->_vptr_PromiseDataBase[1])(this);
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,4,8);
    }
  }
  local_148.d.d = (Data *)0x0;
  local_148.d.ptr = (int *)0x0;
  local_148.d.size = 0;
  waitForValue<QList<int>>(&local_b8,&p,&local_148);
  expectedBegin.i = (int *)QArrayData::allocate((QArrayData **)&resolver_3,4,8,3,KeepSize);
  PVar3 = resolver_3;
  *(undefined1 **)expectedBegin.i = &DAT_2f0000002b;
  expectedBegin.i[2] = 0x31;
  QTest::_q_compareSequence<QList<int>::const_iterator,QList<int>::const_iterator>
            ((const_iterator)local_b8.d.ptr,(const_iterator)(local_b8.d.ptr + local_b8.d.size),
             expectedBegin,(const_iterator)(expectedBegin.i + 3),"waitForValue(p, Sequence{})",
             "(Sequence{43, 47, 49})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_filter.cpp"
             ,0x33);
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      QArrayData::deallocate((QArrayData *)PVar3.m_d.d,4,8);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,4,8);
    }
  }
  if (&(local_148.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_148.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_148.d.d)->super_QArrayData,4,8);
    }
  }
  p.super_QPromiseBase<QList<int>_>._vptr_QPromiseBase = (_func_int **)pDVar4;
  if (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0) {
    LOCK();
    pQVar1 = &((p.super_QPromiseBase<QList<int>_>.m_d.d)->
              super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<QList<int>_>.m_d.d != (PromiseData<QList<int>_> *)0x0)) {
      (*((p.super_QPromiseBase<QList<int>_>.m_d.d)->
        super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_filter::preserveOrder()
{
    auto p =
        QtPromise::QPromise<QVector<int>>::resolve({250, 50, 100, 400, 300}).filter([](int v, ...) {
            return QtPromise::QPromise<bool>::resolve(v > 200).delay(v);
        });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(waitForValue(p, QVector<int>{}), (QVector<int>{250, 400, 300}));
}